

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::end_negative_value
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_visitor<wchar_t> *visitor,error_code *ec)

{
  bool bVar1;
  size_t in_RDX;
  wchar_t *in_RSI;
  string_view_type *in_RDI;
  type tVar2;
  type result;
  int64_t val;
  ser_context *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  semantic_tag tag;
  semantic_tag tag_00;
  basic_json_parser<wchar_t,_std::allocator<char>_> *this_00;
  wchar_t *local_30;
  to_integer_errc local_28;
  long *in_stack_ffffffffffffffe0;
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  this_00 = (basic_json_parser<wchar_t,_std::allocator<char>_> *)&in_RDI[8]._M_str;
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::length();
  tVar2 = detail::to_integer_unchecked<long,wchar_t>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  tag_00 = (semantic_tag)((ulong)in_RSI >> 0x38);
  local_30 = tVar2.ptr;
  local_28 = tVar2.ec;
  bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_30);
  if (bVar1) {
    basic_json_visitor<wchar_t>::int64_value
              ((basic_json_visitor<wchar_t> *)this_00,(int64_t)in_RDI,tag,in_stack_ffffffffffffff88,
               (error_code *)0x60bcc5);
    *(byte *)((long)&in_RDI[7]._M_str + 3) = (*(byte *)((long)&in_RDI[7]._M_str + 5) ^ 0xff) & 1;
  }
  else {
    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&in_RDI[8]._M_str);
    basic_json_visitor<wchar_t>::string_value
              ((basic_json_visitor<wchar_t> *)this_00,in_RDI,tag_00,in_stack_ffffffffffffff88,
               (error_code *)0x60bd1b);
    *(byte *)((long)&in_RDI[7]._M_str + 3) = (*(byte *)((long)&in_RDI[7]._M_str + 5) ^ 0xff) & 1;
  }
  after_value(this_00,(error_code *)in_RDI);
  return;
}

Assistant:

void end_negative_value(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        int64_t val;
        auto result = jsoncons::detail::to_integer_unchecked(string_buffer_.data(), string_buffer_.length(), val);
        if (result)
        {
            visitor.int64_value(val, semantic_tag::none, *this, ec);
            more_ = !cursor_mode_;
        }
        else // Must be overflow
        {
            visitor.string_value(string_buffer_, semantic_tag::bigint, *this, ec);
            more_ = !cursor_mode_;
        }
        after_value(ec);
    }